

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefileCall::~cmMakefileCall(cmMakefileCall *this)

{
  pointer *pppcVar1;
  int *piVar2;
  cmMakefile *pcVar3;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> _Stack_18;
  
  pcVar3 = this->Makefile;
  pppcVar1 = &(pcVar3->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppcVar1 = *pppcVar1 + -1;
  piVar2 = &pcVar3->RecursionDepth;
  *piVar2 = *piVar2 + -1;
  cmListFileBacktrace::Pop((cmListFileBacktrace *)&_Stack_18);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Makefile->Backtrace,&_Stack_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18._M_refcount);
  return;
}

Assistant:

~cmMakefileCall()
  {
    this->Makefile->ExecutionStatusStack.pop_back();
    --this->Makefile->RecursionDepth;
    this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
  }